

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcg64_shift.hpp
# Opt level: O0

basic_istream<char,_std::char_traits<char>_> *
trng::operator>>(basic_istream<char,_std::char_traits<char>_> *in,lcg64_shift *R)

{
  delim_c dVar1;
  bool bVar2;
  fmtflags __fmtfl;
  _Ios_Fmtflags _Var3;
  basic_istream<char,_std::char_traits<char>_> *this;
  basic_istream<char,_std::char_traits<char>_> *S;
  basic_istream<char,_std::char_traits<char>_> *in_00;
  result_type *in_RSI;
  basic_istream<char,_std::char_traits<char>_> *in_RDI;
  fmtflags flags;
  status_type S_new;
  parameter_type P_new;
  basic_istream<char,_std::char_traits<char>_> *in_01;
  delim_str *in_stack_ffffffffffffffa8;
  basic_istream<char,_std::char_traits<char>_> *in_stack_ffffffffffffffb0;
  parameter_type *in_stack_ffffffffffffffb8;
  undefined5 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc5;
  undefined1 in_stack_ffffffffffffffc6;
  status_type local_28;
  parameter_type local_20;
  result_type *local_10;
  basic_istream<char,_std::char_traits<char>_> *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  lcg64_shift::parameter_type::parameter_type(&local_20);
  lcg64_shift::status_type::status_type(&local_28);
  __fmtfl = Catch::clara::std::ios_base::flags
                      ((ios_base *)(local_8 + *(long *)(*(long *)local_8 + -0x18)));
  this = local_8 + *(long *)(*(long *)local_8 + -0x18);
  _Var3 = Catch::clara::std::operator|(_S_dec,_S_fixed);
  _Var3 = Catch::clara::std::operator|(_Var3,_S_left);
  Catch::clara::std::ios_base::flags((ios_base *)this,_Var3);
  in_01 = local_8;
  utility::ignore_spaces();
  utility::operator>>(in_01,(ignore_spaces_cl *)this);
  utility::delim('\0');
  utility::operator>>(in_01,(delim_c *)this);
  lcg64_shift::name();
  utility::delim((char *)this);
  S = utility::operator>>(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  dVar1 = utility::delim('\0');
  utility::operator>>(in_01,(delim_c *)this);
  in_00 = operator>>((basic_istream<char,_std::char_traits<char>_> *)
                     CONCAT17(dVar1.c,CONCAT16(in_stack_ffffffffffffffc6,
                                               CONCAT15(in_stack_ffffffffffffffc5,
                                                        in_stack_ffffffffffffffc0))),
                     in_stack_ffffffffffffffb8);
  utility::delim('\0');
  utility::operator>>(in_01,(delim_c *)this);
  operator>>(in_00,(status_type *)S);
  utility::delim('\0');
  utility::operator>>(in_01,(delim_c *)this);
  bVar2 = std::ios::operator_cast_to_bool((ios *)(local_8 + *(long *)(*(long *)local_8 + -0x18)));
  if (bVar2) {
    *local_10 = local_20.a;
    local_10[1] = local_20.b;
    local_10[2] = local_28.r;
  }
  Catch::clara::std::ios_base::flags
            ((ios_base *)(local_8 + *(long *)(*(long *)local_8 + -0x18)),__fmtfl);
  return local_8;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
        std::basic_istream<char_t, traits_t> &in, lcg64_shift &R) {
      lcg64_shift::parameter_type P_new;
      lcg64_shift::status_type S_new;
      std::ios_base::fmtflags flags(in.flags());
      in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
      in >> utility::ignore_spaces();
      in >> utility::delim('[') >> utility::delim(lcg64_shift::name()) >> utility::delim(' ') >>
          P_new >> utility::delim(' ') >> S_new >> utility::delim(']');
      if (in) {
        R.P = P_new;
        R.S = S_new;
      }
      in.flags(flags);
      return in;
    }